

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O2

void __thiscall helics::SmallBuffer::SmallBuffer(SmallBuffer *this,SmallBuffer *sb)

{
  (this->buffer)._M_elems[0x30] = 0;
  (this->buffer)._M_elems[0x31] = 0;
  (this->buffer)._M_elems[0x32] = 0;
  (this->buffer)._M_elems[0x33] = 0;
  (this->buffer)._M_elems[0x34] = 0;
  (this->buffer)._M_elems[0x35] = 0;
  (this->buffer)._M_elems[0x36] = 0;
  (this->buffer)._M_elems[0x37] = 0;
  (this->buffer)._M_elems[0x38] = 0;
  (this->buffer)._M_elems[0x39] = 0;
  (this->buffer)._M_elems[0x3a] = 0;
  (this->buffer)._M_elems[0x3b] = 0;
  (this->buffer)._M_elems[0x3c] = 0;
  (this->buffer)._M_elems[0x3d] = 0;
  (this->buffer)._M_elems[0x3e] = 0;
  (this->buffer)._M_elems[0x3f] = 0;
  (this->buffer)._M_elems[0x20] = 0;
  (this->buffer)._M_elems[0x21] = 0;
  (this->buffer)._M_elems[0x22] = 0;
  (this->buffer)._M_elems[0x23] = 0;
  (this->buffer)._M_elems[0x24] = 0;
  (this->buffer)._M_elems[0x25] = 0;
  (this->buffer)._M_elems[0x26] = 0;
  (this->buffer)._M_elems[0x27] = 0;
  (this->buffer)._M_elems[0x28] = 0;
  (this->buffer)._M_elems[0x29] = 0;
  (this->buffer)._M_elems[0x2a] = 0;
  (this->buffer)._M_elems[0x2b] = 0;
  (this->buffer)._M_elems[0x2c] = 0;
  (this->buffer)._M_elems[0x2d] = 0;
  (this->buffer)._M_elems[0x2e] = 0;
  (this->buffer)._M_elems[0x2f] = 0;
  this->bufferSize = 0;
  (this->buffer)._M_elems[0x10] = 0;
  (this->buffer)._M_elems[0x11] = 0;
  (this->buffer)._M_elems[0x12] = 0;
  (this->buffer)._M_elems[0x13] = 0;
  (this->buffer)._M_elems[0x14] = 0;
  (this->buffer)._M_elems[0x15] = 0;
  (this->buffer)._M_elems[0x16] = 0;
  (this->buffer)._M_elems[0x17] = 0;
  (this->buffer)._M_elems[0x18] = 0;
  (this->buffer)._M_elems[0x19] = 0;
  (this->buffer)._M_elems[0x1a] = 0;
  (this->buffer)._M_elems[0x1b] = 0;
  (this->buffer)._M_elems[0x1c] = 0;
  (this->buffer)._M_elems[0x1d] = 0;
  (this->buffer)._M_elems[0x1e] = 0;
  (this->buffer)._M_elems[0x1f] = 0;
  (this->buffer)._M_elems[0] = 0;
  (this->buffer)._M_elems[1] = 0;
  (this->buffer)._M_elems[2] = 0;
  (this->buffer)._M_elems[3] = 0;
  (this->buffer)._M_elems[4] = 0;
  (this->buffer)._M_elems[5] = 0;
  (this->buffer)._M_elems[6] = 0;
  (this->buffer)._M_elems[7] = 0;
  (this->buffer)._M_elems[8] = 0;
  (this->buffer)._M_elems[9] = 0;
  (this->buffer)._M_elems[10] = 0;
  (this->buffer)._M_elems[0xb] = 0;
  (this->buffer)._M_elems[0xc] = 0;
  (this->buffer)._M_elems[0xd] = 0;
  (this->buffer)._M_elems[0xe] = 0;
  (this->buffer)._M_elems[0xf] = 0;
  this->bufferCapacity = 0x40;
  this->heap = (byte *)this;
  this->nonOwning = false;
  this->locked = false;
  this->usingAllocatedBuffer = false;
  this->errorCondition = '\0';
  this->userKey = 0;
  resize(this,sb->bufferSize);
  memcpy(this->heap,sb->heap,sb->bufferSize);
  return;
}

Assistant:

SmallBuffer(const SmallBuffer& sb): heap(buffer.data())
    {
        resize(sb.size());
        std::memcpy(heap, sb.heap, sb.size());
    }